

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O1

void cf_socket_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  int sock;
  char *fmt;
  
  sock = *(int *)((long)cf->ctx + 0x98);
  if (sock != -1) {
    if ((cf->field_0x24 & 1) == 0) {
      Curl_pollset_change(data,ps,sock,2,1);
      if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
         (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
        fmt = "adjust_pollset(!connected) -> %d socks";
LAB_00738b58:
        Curl_trc_cf_infof(data,cf,fmt,(ulong)ps->num);
        return;
      }
    }
    else if ((*(byte *)((long)cf->ctx + 0x17c) & 8) == 0) {
      Curl_pollset_change(data,ps,sock,1,0);
      if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
          ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
        fmt = "adjust_pollset(!active) -> %d socks";
        goto LAB_00738b58;
      }
    }
  }
  return;
}

Assistant:

static void cf_socket_adjust_pollset(struct Curl_cfilter *cf,
                                      struct Curl_easy *data,
                                      struct easy_pollset *ps)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  if(ctx->sock != CURL_SOCKET_BAD) {
    if(!cf->connected) {
      Curl_pollset_set_out_only(data, ps, ctx->sock);
      CURL_TRC_CF(data, cf, "adjust_pollset(!connected) -> %d socks", ps->num);
    }
    else if(!ctx->active) {
      Curl_pollset_add_in(data, ps, ctx->sock);
      CURL_TRC_CF(data, cf, "adjust_pollset(!active) -> %d socks", ps->num);
    }
  }
}